

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# end.c
# Opt level: O0

void artifact_score(obj *list,boolean counting,menulist *menu)

{
  long lVar1;
  boolean bVar2;
  char *pcVar3;
  char *pcVar4;
  nh_menuitem *pnVar5;
  char *local_168;
  nh_menuitem *_item_;
  long lStack_140;
  short dummy;
  long points;
  long value;
  obj *otmp;
  char pbuf [256];
  menulist *menu_local;
  boolean counting_local;
  obj *list_local;
  
  for (value = (long)list; value != 0; value = *(long *)value) {
    if ((((*(char *)(value + 0x37) != '\0') || (*(short *)(value + 0x2a) == 0x10c)) ||
        (*(short *)(value + 0x2a) == 0x1bd)) || (*(short *)(value + 0x2a) == 0x10b)) {
      points = arti_cost((obj *)value);
      lStack_140 = (points * 5) / 2;
      if (counting == '\0') {
        discover_object((int)*(short *)(value + 0x2a),'\x01','\x01');
        *(uint *)(value + 0x4a) = *(uint *)(value + 0x4a) & 0xffffff7f | 0x80;
        *(uint *)(value + 0x4a) = *(uint *)(value + 0x4a) & 0xffffffbf | 0x40;
        *(uint *)(value + 0x4a) = *(uint *)(value + 0x4a) & 0xffffffdf | 0x20;
        *(uint *)(value + 0x4a) = *(uint *)(value + 0x4a) & 0xffffffef | 0x10;
        bVar2 = the_unique_obj((obj *)value);
        pcVar3 = "";
        if (bVar2 != '\0') {
          pcVar3 = "The ";
        }
        if (*(char *)(value + 0x37) == '\0') {
          local_168 = obj_descr[objects[*(short *)(value + 0x2a)].oc_name_idx].oc_name;
        }
        else {
          pcVar4 = xname((obj *)value);
          local_168 = artifact_name(pcVar4,(short *)((long)&_item_ + 6));
        }
        lVar1 = points;
        pcVar4 = currency(points);
        sprintf((char *)&otmp,"%s%s (worth %ld %s and %ld points)",pcVar3,local_168,lVar1,pcVar4,
                lStack_140);
        if (menu->size <= menu->icount) {
          menu->size = menu->size << 1;
          pnVar5 = (nh_menuitem *)realloc(menu->items,(long)menu->size * 0x10c);
          menu->items = pnVar5;
        }
        pnVar5 = menu->items + menu->icount;
        pnVar5->id = 0;
        pnVar5->role = MI_TEXT;
        pnVar5->accel = '\0';
        pnVar5->group_accel = '\0';
        pnVar5->selected = '\0';
        strcpy(pnVar5->caption,(char *)&otmp);
        menu->icount = menu->icount + 1;
      }
      else {
        u.urscore = u.urscore + (int)lStack_140;
      }
    }
    if (*(long *)(value + 0x10) != 0) {
      artifact_score(*(obj **)(value + 0x10),counting,menu);
    }
  }
  return;
}

Assistant:

static void artifact_score(struct obj *list,
			   boolean counting, /* true => add up points; false => display them */
			   struct menulist *menu)
{
    char pbuf[BUFSZ];
    struct obj *otmp;
    long value, points;
    short dummy;	/* object type returned by artifact_name() */

    for (otmp = list; otmp; otmp = otmp->nobj) {
	if (otmp->oartifact ||
			otmp->otyp == BELL_OF_OPENING ||
			otmp->otyp == SPE_BOOK_OF_THE_DEAD ||
			otmp->otyp == CANDELABRUM_OF_INVOCATION) {
	    value = arti_cost(otmp);	/* zorkmid value */
	    points = value * 5 / 2;	/* score value */
	    if (counting) {
		u.urscore += points;
	    } else {
		makeknown(otmp->otyp);
		otmp->known = otmp->dknown = otmp->bknown = otmp->rknown = 1;
		/* assumes artifacts don't have quan > 1 */
		sprintf(pbuf, "%s%s (worth %ld %s and %ld points)",
			the_unique_obj(otmp) ? "The " : "",
			otmp->oartifact ? artifact_name(xname(otmp), &dummy) :
				OBJ_NAME(objects[otmp->otyp]),
			value, currency(value), points);
		add_menutext(menu, pbuf);
	    }
	}
	if (Has_contents(otmp))
	    artifact_score(otmp->cobj, counting, menu);
    }
}